

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

AMQP_VALUE amqpvalue_create_close(CLOSE_HANDLE close)

{
  AMQP_VALUE pAVar1;
  
  if (close != (CLOSE_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(close->composite_value);
    return pAVar1;
  }
  return (AMQP_VALUE)0x0;
}

Assistant:

AMQP_VALUE amqpvalue_create_close(CLOSE_HANDLE close)
{
    AMQP_VALUE result;

    if (close == NULL)
    {
        result = NULL;
    }
    else
    {
        CLOSE_INSTANCE* close_instance = (CLOSE_INSTANCE*)close;
        result = amqpvalue_clone(close_instance->composite_value);
    }

    return result;
}